

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

BOOL QueryThreadCycleTime(HANDLE ThreadHandle,PULONG64 CycleTime)

{
  BOOL BVar1;
  uint local_34;
  uint local_30;
  BOOL retval;
  FILETIME userTime;
  FILETIME kernelTime;
  ULONG64 calcTime;
  PULONG64 CycleTime_local;
  HANDLE ThreadHandle_local;
  
  BVar1 = CorUnix::GetThreadTimesInternal
                    (ThreadHandle,&userTime,(LPFILETIME)&stack0xffffffffffffffd0);
  if (BVar1 != 0) {
    *CycleTime = (ulong)local_30 +
                 ((ulong)(uint)retval << 0x20) +
                 CONCAT44(userTime.dwHighDateTime,userTime.dwLowDateTime);
  }
  else {
    fprintf(_stderr,"] %s %s:%d","QueryThreadCycleTime",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/time.cpp"
            ,0x12e);
    fprintf(_stderr,"Could not get cycle time for current thread");
  }
  local_34 = (uint)(BVar1 != 0);
  return local_34;
}

Assistant:

BOOL
PALAPI
QueryThreadCycleTime(
    IN HANDLE ThreadHandle,
    OUT PULONG64 CycleTime
    )
{

    ULONG64 calcTime;
    FILETIME kernelTime, userTime;
    BOOL retval = TRUE;

    if(!GetThreadTimesInternal(ThreadHandle, &kernelTime, &userTime))
    {
        ASSERT("Could not get cycle time for current thread");
        retval = FALSE;
        goto EXIT;
    }

    calcTime = ((ULONG64)kernelTime.dwHighDateTime << 32);
    calcTime += (ULONG64)kernelTime.dwLowDateTime;
    calcTime += ((ULONG64)userTime.dwHighDateTime << 32);
    calcTime += (ULONG64)userTime.dwLowDateTime;
    *CycleTime = calcTime;

EXIT:
    return retval;
}